

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  TestResult *pTVar1;
  internal *piVar2;
  TimeInMillis ms;
  TimeInMillis ms_00;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  TestResult *local_18;
  TestResult *result_local;
  ostream *stream_local;
  
  local_18 = result;
  result_local = (TestResult *)stream;
  std::operator<<(stream,"  <testsuite");
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"testsuite",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"name",&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"NonTestSuiteFailure",&local_99);
  OutputXmlAttribute((ostream *)pTVar1,&local_38,&local_70,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"testsuite",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"tests",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"1",&local_111);
  OutputXmlAttribute((ostream *)pTVar1,&local_c0,&local_e8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"testsuite",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,"failures",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"1",&local_189);
  OutputXmlAttribute((ostream *)pTVar1,&local_138,&local_160,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"testsuite",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"disabled",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"0",&local_201);
  OutputXmlAttribute((ostream *)pTVar1,&local_1b0,&local_1d8,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"testsuite",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"skipped",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"0",&local_279);
  OutputXmlAttribute((ostream *)pTVar1,&local_228,&local_250,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"testsuite",&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"errors",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"0",&local_2f1);
  OutputXmlAttribute((ostream *)pTVar1,&local_2a0,&local_2c8,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"testsuite",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"time",&local_341);
  piVar2 = (internal *)TestResult::elapsed_time(local_18);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_368,piVar2,ms);
  OutputXmlAttribute((ostream *)pTVar1,&local_318,&local_340,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  pTVar1 = result_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_388,"testsuite",&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b0,"timestamp",&local_3b1);
  piVar2 = (internal *)TestResult::start_timestamp(local_18);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_3d8,piVar2,ms_00);
  OutputXmlAttribute((ostream *)pTVar1,&local_388,&local_3b0,&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::operator<<((ostream *)result_local,">");
  OutputXmlTestCaseForTestResult((ostream *)result_local,local_18);
  std::operator<<((ostream *)result_local,"  </testsuite>\n");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a minimal test suite with one test.
  *stream << "  <testsuite";
  OutputXmlAttribute(stream, "testsuite", "name", "NonTestSuiteFailure");
  OutputXmlAttribute(stream, "testsuite", "tests", "1");
  OutputXmlAttribute(stream, "testsuite", "failures", "1");
  OutputXmlAttribute(stream, "testsuite", "disabled", "0");
  OutputXmlAttribute(stream, "testsuite", "skipped", "0");
  OutputXmlAttribute(stream, "testsuite", "errors", "0");
  OutputXmlAttribute(stream, "testsuite", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testsuite", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  *stream << ">";

  OutputXmlTestCaseForTestResult(stream, result);

  // Complete the test suite.
  *stream << "  </testsuite>\n";
}